

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MemPass::DCEInst
          (MemPass *this,Instruction *inst,function<void_(spvtools::opt::Instruction_*)> *call_back)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color id;
  Instruction *this_00;
  uint32_t ptr_id;
  bool bVar2;
  DefUseManager *this_01;
  _Base_ptr p_Var3;
  uint32_t varId;
  Instruction *odi;
  undefined8 local_d0;
  code *local_c8;
  code *local_c0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> ids;
  Instruction *inst_local;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  deadInsts;
  
  inst_local = inst;
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            (&deadInsts);
  std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::push_back
            (&deadInsts.c,&inst_local);
  p_Var1 = &ids._M_t._M_impl.super__Rb_tree_header;
  while (deadInsts.c.
         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         deadInsts.c.
         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = *deadInsts.c.
               super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (this_00->opcode_ == OpLabel) {
      std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      pop_front(&deadInsts.c);
    }
    else {
      ids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d0 = 0;
      odi = (Instruction *)&ids;
      local_c0 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:207:21)>
                 ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:207:21)>
                 ::_M_manager;
      ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      ids._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      Instruction::ForEachInId(this_00,(function<void_(unsigned_int_*)> *)&odi);
      if (local_c8 != (code *)0x0) {
        (*local_c8)((_Any_data *)&odi,(_Any_data *)&odi,__destroy_functor);
      }
      varId = 0;
      if (this_00->opcode_ == OpLoad) {
        GetPtr(this,this_00,&varId);
      }
      if ((call_back->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::function<void_(spvtools::opt::Instruction_*)>::operator()(call_back,this_00);
      }
      IRContext::KillInst((this->super_Pass).context_,this_00);
      for (p_Var3 = ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left; ptr_id = varId,
          (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3))
      {
        id = p_Var3[1]._M_color;
        bVar2 = HasOnlyNamesAndDecorates(this,id);
        if (bVar2) {
          this_01 = Pass::get_def_use_mgr(&this->super_Pass);
          odi = analysis::DefUseManager::GetDef(this_01,id);
          bVar2 = IRContext::IsCombinatorInstruction((this->super_Pass).context_,odi);
          if (bVar2) {
            std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::push_back(&deadInsts.c,(value_type *)&odi);
          }
        }
      }
      if (varId != 0) {
        bVar2 = IsLiveVar(this,varId);
        if (!bVar2) {
          AddStores(this,ptr_id,&deadInsts);
        }
      }
      std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      pop_front(&deadInsts.c);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&ids._M_t);
    }
  }
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base((_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&deadInsts);
  return;
}

Assistant:

void MemPass::DCEInst(Instruction* inst,
                      const std::function<void(Instruction*)>& call_back) {
  std::queue<Instruction*> deadInsts;
  deadInsts.push(inst);
  while (!deadInsts.empty()) {
    Instruction* di = deadInsts.front();
    // Don't delete labels
    if (di->opcode() == spv::Op::OpLabel) {
      deadInsts.pop();
      continue;
    }
    // Remember operands
    std::set<uint32_t> ids;
    di->ForEachInId([&ids](uint32_t* iid) { ids.insert(*iid); });
    uint32_t varId = 0;
    // Remember variable if dead load
    if (di->opcode() == spv::Op::OpLoad) (void)GetPtr(di, &varId);
    if (call_back) {
      call_back(di);
    }
    context()->KillInst(di);
    // For all operands with no remaining uses, add their instruction
    // to the dead instruction queue.
    for (auto id : ids)
      if (HasOnlyNamesAndDecorates(id)) {
        Instruction* odi = get_def_use_mgr()->GetDef(id);
        if (context()->IsCombinatorInstruction(odi)) deadInsts.push(odi);
      }
    // if a load was deleted and it was the variable's
    // last load, add all its stores to dead queue
    if (varId != 0 && !IsLiveVar(varId)) AddStores(varId, &deadInsts);
    deadInsts.pop();
  }
}